

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O0

void labpack_writer_buffer_data(labpack_writer_t *writer,char *buffer)

{
  _Bool _Var1;
  char *buffer_local;
  labpack_writer_t *writer_local;
  
  if (writer == (labpack_writer_t *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                  ,0xae,"void labpack_writer_buffer_data(labpack_writer_t *, char *)");
  }
  _Var1 = labpack_writer_is_ok(writer);
  if (_Var1) {
    if (buffer == (char *)0x0) {
      writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
      writer->status_message = "The buffer cannot be NULL";
    }
    else if (writer->buffer == (char *)0x0) {
      writer->status = LABPACK_STATUS_ERROR_ENCODER;
      writer->status_message = "The encoder is not done";
    }
    else {
      memcpy(buffer,writer->buffer,writer->size);
    }
  }
  return;
}

Assistant:

void
labpack_writer_buffer_data(labpack_writer_t* writer, char* buffer)
{
    assert(writer);
    if (labpack_writer_is_ok(writer)) {
        if (!buffer) {
            writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
            writer->status_message = "The buffer cannot be NULL";
            return;
        }
        if (!writer->buffer) {
            writer->status = LABPACK_STATUS_ERROR_ENCODER;
            writer->status_message = "The encoder is not done";
            return;
        }
        memcpy(buffer, writer->buffer, writer->size);
    }
}